

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

Node * StripSpan(TidyDocImpl *doc,Node *span)

{
  Node *pNVar1;
  Node *element;
  Node *pNVar2;
  
  prvTidyCleanWord2000(doc,span->content);
  pNVar2 = span->content;
  element = span->prev;
  if (span->prev == (Node *)0x0) {
    if (pNVar2 == (Node *)0x0) {
      element = (Node *)0x0;
      pNVar2 = (Node *)0x0;
    }
    else {
      pNVar1 = pNVar2->next;
      prvTidyRemoveNode(pNVar2);
      prvTidyInsertNodeBeforeElement(span,pNVar2);
      element = pNVar2;
      pNVar2 = pNVar1;
    }
  }
  while (pNVar2 != (Node *)0x0) {
    pNVar1 = pNVar2->next;
    prvTidyRemoveNode(pNVar2);
    prvTidyInsertNodeAfterElement(element,pNVar2);
    element = pNVar2;
    pNVar2 = pNVar1;
  }
  pNVar2 = span->next;
  if (pNVar2 == (Node *)0x0) {
    span->parent->last = element;
  }
  span->content = (Node *)0x0;
  prvTidyDiscardElement(doc,span);
  return pNVar2;
}

Assistant:

static Node* StripSpan( TidyDocImpl* doc, Node* span )
{
    Node *node, *prev = NULL, *content;

    /*
     deal with span elements that have content
     by splicing the content in place of the span
     after having processed it
    */

    TY_(CleanWord2000)( doc, span->content );
    content = span->content;

    if (span->prev)
        prev = span->prev;
    else if (content)
    {
        node = content;
        content = content->next;
        TY_(RemoveNode)(node);
        TY_(InsertNodeBeforeElement)(span, node);
        prev = node;
    }

    while (content)
    {
        node = content;
        content = content->next;
        TY_(RemoveNode)(node);
        TY_(InsertNodeAfterElement)(prev, node);
        prev = node;
    }

    if (span->next == NULL)
        span->parent->last = prev;

    node = span->next;
    span->content = NULL;
    TY_(DiscardElement)( doc, span );
    return node;
}